

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_escape_stair(void)

{
  borg_grid *ag;
  
  if ((borg_grids[borg.c.y][borg.c.x].feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
    borg_note("# Escaping level via stairs.");
    borg_keypress(0x3c);
    ag._7_1_ = true;
  }
  else {
    ag._7_1_ = false;
  }
  return ag._7_1_;
}

Assistant:

static bool borg_escape_stair(void)
{
    /* Current grid */
    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* Usable stairs */
    if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
        /* Take the stairs */
        borg_note("# Escaping level via stairs.");
        borg_keypress('<');

        /* Success */
        return true;
    }

    return false;
}